

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenSIMDShiftSetVec(BinaryenExpressionRef expr,BinaryenExpressionRef vecExpr)

{
  if (expr->_id != SIMDShiftId) {
    __assert_fail("expression->is<SIMDShift>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xd00,
                  "void BinaryenSIMDShiftSetVec(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (vecExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)vecExpr;
    return;
  }
  __assert_fail("vecExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xd01,"void BinaryenSIMDShiftSetVec(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenSIMDShiftSetVec(BinaryenExpressionRef expr,
                             BinaryenExpressionRef vecExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDShift>());
  assert(vecExpr);
  static_cast<SIMDShift*>(expression)->vec = (Expression*)vecExpr;
}